

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O2

int cgltf_parse_json_texture_view
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_texture_view *out_texture_view)

{
  cgltf_size cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  cgltf_extension *pcVar7;
  cgltf_texture_view *out_extras;
  cgltf_texture_view *pcVar8;
  cgltf_texture_view *pcVar9;
  ulong uVar10;
  jsmntok_t *pjVar11;
  int iVar12;
  cgltf_float cVar13;
  int local_64;
  
  if (tokens[(uint)i].type == JSMN_OBJECT) {
    out_texture_view->scale = 1.0;
    (out_texture_view->transform).scale[0] = 1.0;
    (out_texture_view->transform).scale[1] = 1.0;
    iVar2 = tokens[(uint)i].size;
    uVar10 = (ulong)(i + 1);
    out_extras = (cgltf_texture_view *)0x0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    iVar12 = 0;
    do {
      iVar6 = (int)uVar10;
      if (iVar12 == iVar2) {
        return iVar6;
      }
      if ((tokens[uVar10].type != JSMN_STRING) || (pjVar11 = tokens + uVar10, pjVar11->size == 0)) {
        return -1;
      }
      iVar3 = cgltf_json_strcmp(pjVar11,json_chunk,"index");
      if (iVar3 == 0) {
        iVar3 = cgltf_json_to_int(tokens + (long)iVar6 + 1,json_chunk);
        out_texture_view->texture = (cgltf_texture *)((long)iVar3 + 1);
        out_extras = out_texture_view;
LAB_00116c76:
        uVar10 = (ulong)(iVar6 + 2);
      }
      else {
        iVar3 = cgltf_json_strcmp(pjVar11,json_chunk,"texCoord");
        if (iVar3 == 0) {
          iVar3 = cgltf_json_to_int(tokens + (long)iVar6 + 1,json_chunk);
          out_texture_view->texcoord = iVar3;
          out_extras = out_texture_view;
          goto LAB_00116c76;
        }
        iVar3 = cgltf_json_strcmp(pjVar11,json_chunk,"scale");
        if ((iVar3 == 0) || (iVar3 = cgltf_json_strcmp(pjVar11,json_chunk,"strength"), iVar3 == 0))
        {
          cVar13 = cgltf_json_to_float(tokens + (long)iVar6 + 1,json_chunk);
          out_texture_view->scale = cVar13;
          goto LAB_00116c76;
        }
        iVar3 = cgltf_json_strcmp(pjVar11,json_chunk,"extras");
        if (iVar3 == 0) {
          uVar4 = cgltf_parse_json_extras
                            (tokens,iVar6 + 1,(uint8_t *)&out_texture_view->extras,
                             (cgltf_extras *)out_extras);
LAB_00116c9a:
          uVar10 = (ulong)uVar4;
        }
        else {
          iVar3 = cgltf_json_strcmp(pjVar11,json_chunk,"extensions");
          if (iVar3 != 0) {
            uVar4 = cgltf_skip_json(tokens,iVar6 + 1);
            goto LAB_00116c9a;
          }
          if (tokens[(long)iVar6 + 1].type != JSMN_OBJECT) {
            return -1;
          }
          if (out_texture_view->extensions != (cgltf_extension *)0x0) {
            return -1;
          }
          iVar3 = tokens[(long)iVar6 + 1].size;
          out_texture_view->extensions_count = 0;
          pcVar7 = (cgltf_extension *)cgltf_calloc(options,0x10,(long)iVar3);
          out_texture_view->extensions = pcVar7;
          if (pcVar7 == (cgltf_extension *)0x0) {
            return -2;
          }
          uVar10 = (ulong)(iVar6 + 2);
          local_64 = 0;
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          while (local_64 != iVar3) {
            iVar6 = (int)uVar10;
            if (tokens[uVar10].type != JSMN_STRING) {
              return -1;
            }
            if (tokens[uVar10].size == 0) {
              return -1;
            }
            iVar5 = cgltf_json_strcmp(tokens + uVar10,json_chunk,"KHR_texture_transform");
            if (iVar5 == 0) {
              out_texture_view->has_transform = 1;
              if (tokens[(long)iVar6 + 1].type != JSMN_OBJECT) {
                return -1;
              }
              iVar5 = tokens[(long)iVar6 + 1].size;
              uVar4 = iVar6 + 2;
              if (iVar5 < 1) {
                iVar5 = 0;
              }
              iVar5 = iVar5 + 1;
              while( true ) {
                uVar10 = (ulong)uVar4;
                iVar5 = iVar5 + -1;
                if (iVar5 == 0) break;
                if (tokens[uVar10].type != JSMN_STRING) {
                  return -1;
                }
                pjVar11 = tokens + uVar10;
                if (pjVar11->size == 0) {
                  return -1;
                }
                iVar6 = cgltf_json_strcmp(pjVar11,json_chunk,"offset");
                out_extras = (cgltf_texture_view *)&out_texture_view->transform;
                if (iVar6 == 0) {
LAB_00116e74:
                  uVar4 = cgltf_parse_json_float_array
                                    (tokens,uVar4 + 1,json_chunk,(float *)out_extras,2);
                }
                else {
                  iVar6 = cgltf_json_strcmp(pjVar11,json_chunk,"rotation");
                  pcVar8 = (cgltf_texture_view *)(long)(int)uVar4;
                  if (iVar6 == 0) {
                    cVar13 = cgltf_json_to_float(tokens + (long)((long)&pcVar8->texture + 1),
                                                 json_chunk);
                    (out_texture_view->transform).rotation = cVar13;
LAB_00116e9b:
                    uVar4 = uVar4 + 2;
                    out_extras = pcVar8;
                  }
                  else {
                    pcVar9 = pcVar8;
                    iVar6 = cgltf_json_strcmp(pjVar11,json_chunk,"scale");
                    out_extras = (cgltf_texture_view *)(out_texture_view->transform).scale;
                    if (iVar6 == 0) goto LAB_00116e74;
                    iVar6 = cgltf_json_strcmp(pjVar11,json_chunk,"texCoord");
                    if (iVar6 == 0) {
                      iVar6 = cgltf_json_to_int(tokens + (long)((long)&pcVar8->texture + 1),
                                                json_chunk);
                      (out_texture_view->transform).texcoord = iVar6;
                      pcVar8 = out_texture_view;
                      goto LAB_00116e9b;
                    }
                    uVar4 = cgltf_skip_json(tokens,uVar4 + 1);
                    out_extras = pcVar9;
                  }
                }
                if ((int)uVar4 < 0) {
                  return uVar4;
                }
              }
            }
            else {
              cVar1 = out_texture_view->extensions_count;
              out_texture_view->extensions_count = cVar1 + 1;
              out_extras = (cgltf_texture_view *)json_chunk;
              uVar4 = cgltf_parse_json_unprocessed_extension
                                (options,tokens,iVar6,json_chunk,
                                 out_texture_view->extensions + cVar1);
              uVar10 = (ulong)uVar4;
            }
            local_64 = local_64 + 1;
            if ((int)uVar10 < 0) {
              return (int)uVar10;
            }
          }
        }
      }
      iVar12 = iVar12 + 1;
      iVar6 = (int)uVar10;
    } while (-1 < iVar6);
  }
  else {
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int cgltf_parse_json_texture_view(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_texture_view* out_texture_view)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);

	out_texture_view->scale = 1.0f;
	cgltf_fill_float_array(out_texture_view->transform.scale, 2, 1.0f);

	int size = tokens[i].size;
	++i;

	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_KEY(tokens[i]);

		if (cgltf_json_strcmp(tokens + i, json_chunk, "index") == 0)
		{
			++i;
			out_texture_view->texture = CGLTF_PTRINDEX(cgltf_texture, cgltf_json_to_int(tokens + i, json_chunk));
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "texCoord") == 0)
		{
			++i;
			out_texture_view->texcoord = cgltf_json_to_int(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "scale") == 0) 
		{
			++i;
			out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "strength") == 0)
		{
			++i;
			out_texture_view->scale = cgltf_json_to_float(tokens + i, json_chunk);
			++i;
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "extras") == 0)
		{
			i = cgltf_parse_json_extras(tokens, i + 1, json_chunk, &out_texture_view->extras);
		}
		else if (cgltf_json_strcmp(tokens + i, json_chunk, "extensions") == 0)
		{
			++i;

			CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_OBJECT);
			if(out_texture_view->extensions)
			{
				return CGLTF_ERROR_JSON;
			}

			int extensions_size = tokens[i].size;
			out_texture_view->extensions_count = 0;
			out_texture_view->extensions = (cgltf_extension*)cgltf_calloc(options, sizeof(cgltf_extension), extensions_size);

			if (!out_texture_view->extensions)
			{
				return CGLTF_ERROR_NOMEM;
			}

			++i;

			for (int k = 0; k < extensions_size; ++k)
			{
				CGLTF_CHECK_KEY(tokens[i]);

				if (cgltf_json_strcmp(tokens+i, json_chunk, "KHR_texture_transform") == 0)
				{
					out_texture_view->has_transform = 1;
					i = cgltf_parse_json_texture_transform(tokens, i + 1, json_chunk, &out_texture_view->transform);
				}
				else
				{
					i = cgltf_parse_json_unprocessed_extension(options, tokens, i, json_chunk, &(out_texture_view->extensions[out_texture_view->extensions_count++]));
				}

				if (i < 0)
				{
					return i;
				}
			}
		}
		else
		{
			i = cgltf_skip_json(tokens, i + 1);
		}

		if (i < 0)
		{
			return i;
		}
	}

	return i;
}